

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_append_columns(fitsfile *ff,NGP_HDU *ngph,int aftercol)

{
  NGP_TOKEN *pNVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  char *tform;
  int ngph_i;
  int local_4c;
  int r;
  char ngph_ctmp;
  char *local_40;
  fitsfile *local_38;
  
  r = 0x16a;
  if (ngph != (NGP_HDU *)0x0 && ff != (fitsfile *)0x0) {
    if (ngph->tokcnt == 0) {
LAB_001b438d:
      r = 0;
    }
    else {
      r = 0;
      local_38 = ff;
      do {
        if (0x3e6 < aftercol) goto LAB_001b438d;
        local_4c = aftercol + 1;
        lVar4 = -1;
        lVar5 = 0;
        tform = (char *)0x0;
        local_40 = "";
        do {
          iVar2 = __isoc99_sscanf(ngph->tok->name + lVar5,"TFORM%d%c",&ngph_i,&ngph_ctmp);
          pNVar1 = ngph->tok;
          if (iVar2 == 1) {
            if ((*(int *)(pNVar1->name + lVar5 + -4) == 2) && (ngph_i == local_4c)) {
              tform = *(char **)(pNVar1->comment + lVar5 + -0x10);
            }
          }
          else {
            iVar2 = __isoc99_sscanf(pNVar1->name + lVar5,"TTYPE%d%c",&ngph_i,&ngph_ctmp);
            if (((iVar2 == 1) && (*(int *)(ngph->tok->name + lVar5 + -4) == 2)) &&
               (ngph_i == local_4c)) {
              local_40 = *(char **)(ngph->tok->comment + lVar5 + -0x10);
            }
          }
          aftercol = local_4c;
          if ((tform != (char *)0x0) && (*local_40 != '\0')) {
            bVar3 = 0;
            goto LAB_001b4341;
          }
          lVar5 = lVar5 + 0xb0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (long)ngph->tokcnt + -1);
        bVar3 = 1;
LAB_001b4341:
        if (r == 0 && tform != (char *)0x0) {
          fficol(local_38,local_4c,local_40,tform,&r);
        }
      } while ((bool)(~bVar3 & r == 0));
    }
  }
  return r;
}

Assistant:

int	ngp_append_columns(fitsfile *ff, NGP_HDU *ngph, int aftercol)
 { int		r, i, j, exitflg, ngph_i;
   char 	*my_tform, *my_ttype;
   char		ngph_ctmp;


   if (NULL == ff) return(NGP_NUL_PTR);
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (0 == ngph->tokcnt) return(NGP_OK);	/* nothing to do ! */

   r = NGP_OK;
   exitflg = 0;

   for (j=aftercol; j<NGP_MAX_ARRAY_DIM; j++)	/* 0 for table, 6 for group */
    { 
      my_tform = NULL;
      my_ttype = "";
    
      for (i=0; ; i++)
       { if (1 == sscanf(ngph->tok[i].name, "TFORM%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
   	    { my_tform = ngph->tok[i].value.s;
   	    }
                }
         else if (1 == sscanf(ngph->tok[i].name, "TTYPE%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
               { my_ttype = ngph->tok[i].value.s;
               }
           }
         
         if ((NULL != my_tform) && (my_ttype[0])) break;
         
         if (i < (ngph->tokcnt - 1)) continue;
         exitflg = 1;
         break;
       }
      if ((NGP_OK == r) && (NULL != my_tform))
        fits_insert_col(ff, j + 1, my_ttype, my_tform, &r);

      if ((NGP_OK != r) || exitflg) break;
    }
   return(r);
 }